

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

void ctype_appnum(CTRepr *ctr,uint32_t n)

{
  char *pcVar1;
  char *pcVar2;
  char *local_30;
  char *q;
  char *p;
  char cStack_17;
  char buf [10];
  uint32_t n_local;
  CTRepr *ctr_local;
  
  q = buf + 2;
  local_30 = ctr->pe;
  buf._2_4_ = n;
  if (ctr->buf + 0x1f6 < local_30) {
    ctr->ok = 0;
  }
  else {
    do {
      pcVar1 = q + -1;
      q[-1] = (char)((ulong)(uint)buf._2_4_ % 10) + '0';
      buf._2_4_ = (uint)buf._2_4_ / 10;
      q = pcVar1;
    } while (buf._2_4_ != 0);
    do {
      pcVar1 = q + 1;
      pcVar2 = local_30 + 1;
      *local_30 = *q;
      local_30 = pcVar2;
      q = pcVar1;
    } while (pcVar1 < buf + 2);
    ctr->pe = pcVar2;
  }
  return;
}

Assistant:

static void ctype_appnum(CTRepr *ctr, uint32_t n)
{
  char buf[10];
  char *p = buf+sizeof(buf);
  char *q = ctr->pe;
  if (q > ctr->buf + CTREPR_MAX - 10) { ctr->ok = 0; return; }
  do { *--p = (char)('0' + n % 10); } while (n /= 10);
  do { *q++ = *p++; } while (p < buf+sizeof(buf));
  ctr->pe = q;
}